

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceVkImpl::SubmitCommandBuffer
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkSubmitInfo *SubmitInfo,
          Uint64 *SubmittedCmdBuffNumber,Uint64 *SubmittedFenceValue,
          vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *pSignalFences)

{
  pointer ppVar1;
  FenceVkImpl *this_00;
  Uint64 Value;
  pointer ppVar2;
  SubmittedCommandBufferInfo SVar3;
  SyncPointVkPtr pSyncPoint;
  SyncPointVkPtr local_48;
  RefCountersImpl *local_30;
  
  SVar3 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ::SubmitCommandBuffer<VkSubmitInfo>
                    (&this->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ,CommandQueueId,true,SubmitInfo);
  *SubmittedFenceValue = SVar3.FenceValue;
  *SubmittedCmdBuffNumber = SVar3.CmdBufferNumber;
  if ((pSignalFences !=
       (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
        *)0x0) &&
     ((pSignalFences->
      super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pSignalFences->
      super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    RefCntAutoPtr<Diligent::ICommandQueueVk>::RawPtr<Diligent::CommandQueueVkImpl>
              (&(this->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).m_CommandQueues[CommandQueueId.m_Value].CmdQueue);
    CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)&stack0xffffffffffffffc8);
    ppVar1 = (pSignalFences->
             super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30;
    for (ppVar2 = (pSignalFences->
                  super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1)
    {
      this_00 = (ppVar2->second).m_pObject;
      local_30 = (RefCountersImpl *)
                 local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if ((this_00->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
        Value = ppVar2->first;
        if ((RefCountersImpl *)
            local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (RefCountersImpl *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((RefCountersImpl *)
                    local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->m_ObjectWrapperBuffer =
                 (int)((RefCountersImpl *)
                      local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->m_ObjectWrapperBuffer[0] + 1;
            UNLOCK();
          }
          else {
            *(int *)((RefCountersImpl *)
                    local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->m_ObjectWrapperBuffer =
                 (int)((RefCountersImpl *)
                      local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->m_ObjectWrapperBuffer[0] + 1;
          }
        }
        FenceVkImpl::AddPendingSyncPoint(this_00,CommandQueueId,Value,&local_48);
        if (local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30;
    }
    if ((RefCountersImpl *)
        local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (RefCountersImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void RenderDeviceVkImpl::SubmitCommandBuffer(SoftwareQueueIndex                                          CommandQueueId,
                                             const VkSubmitInfo&                                         SubmitInfo,
                                             Uint64&                                                     SubmittedCmdBuffNumber, // Number of the submitted command buffer
                                             Uint64&                                                     SubmittedFenceValue,    // Fence value associated with the submitted command buffer
                                             std::vector<std::pair<Uint64, RefCntAutoPtr<FenceVkImpl>>>* pSignalFences           // List of fences to signal
)
{
    // Submit the command list to the queue
    SubmittedCommandBufferInfo CmbBuffInfo = TRenderDeviceBase::SubmitCommandBuffer(CommandQueueId, true, SubmitInfo);
    SubmittedFenceValue                    = CmbBuffInfo.FenceValue;
    SubmittedCmdBuffNumber                 = CmbBuffInfo.CmdBufferNumber;

    if (pSignalFences != nullptr && !pSignalFences->empty())
    {
        CommandQueueVkImpl* pQueue     = m_CommandQueues[CommandQueueId].CmdQueue.RawPtr<CommandQueueVkImpl>();
        SyncPointVkPtr      pSyncPoint = pQueue->GetLastSyncPoint();

        for (auto& val_fence : *pSignalFences)
        {
            FenceVkImpl* pFenceVkImpl = val_fence.second;
            if (!pFenceVkImpl->IsTimelineSemaphore())
                pFenceVkImpl->AddPendingSyncPoint(CommandQueueId, val_fence.first, pSyncPoint);
        }
    }
}